

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

char * luaL_optlstring(lua_State *L,int narg,char *def,size_t *len)

{
  TValue *pTVar1;
  char *pcVar2;
  size_t sVar3;
  
  pTVar1 = index2adr(L,narg);
  if ((pTVar1 != &luaO_nilobject_) && (0 < pTVar1->tt)) {
    pcVar2 = luaL_checklstring(L,narg,len);
    return pcVar2;
  }
  if (len != (size_t *)0x0) {
    if (def == (char *)0x0) {
      sVar3 = 0;
    }
    else {
      sVar3 = strlen(def);
    }
    *len = sVar3;
  }
  return def;
}

Assistant:

static const char*luaL_optlstring(lua_State*L,int narg,
const char*def,size_t*len){
if(lua_isnoneornil(L,narg)){
if(len)
*len=(def?strlen(def):0);
return def;
}
else return luaL_checklstring(L,narg,len);
}